

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

String * Time::toString(String *__return_storage_ptr__,int64 time,char *format,bool utc)

{
  tm *__tp;
  char *__s;
  size_t sVar1;
  usize size;
  time_t timet;
  long local_20;
  
  if (*format == '\0') {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
  }
  else {
    local_20 = time / 1000;
    if (utc) {
      __tp = gmtime(&local_20);
    }
    else {
      __tp = localtime(&local_20);
    }
    String::String(__return_storage_ptr__,0x100);
    if (__tp != (tm *)0x0) {
      while( true ) {
        __s = String::operator_cast_to_char_(__return_storage_ptr__);
        if (__return_storage_ptr__->data->ref == 1) {
          sVar1 = __return_storage_ptr__->data->capacity;
        }
        else {
          sVar1 = 0;
        }
        sVar1 = strftime(__s,sVar1,format,__tp);
        if (sVar1 != 0) break;
        if (__return_storage_ptr__->data->ref == 1) {
          size = __return_storage_ptr__->data->capacity * 2;
        }
        else {
          size = 0;
        }
        String::reserve(__return_storage_ptr__,size);
      }
      String::resize(__return_storage_ptr__,sVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(int64 time, const char* format, bool utc)
{
  if(!*format)
    return String();
  time_t timet = (time_t)(time / 1000);
  const tm* tms = utc ? ::gmtime(&timet) : ::localtime(&timet);
  String result(256);
  if(!tms)
    return result;
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, tms);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}